

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo1.cpp
# Opt level: O0

int64_t primecount::pi_lmo1(int64_t x)

{
  bool bVar1;
  size_t sVar2;
  long lVar3;
  int64_t iVar4;
  int *piVar5;
  int64_t iVar6;
  long lVar7;
  long in_RDI;
  int64_t sum;
  int64_t phi;
  int64_t m;
  int64_t b;
  int64_t n;
  int64_t p2;
  int64_t pi_y;
  bool is_print;
  Vector<int,_std::allocator<int>_> mu;
  Vector<int,_std::allocator<int>_> lpf;
  type primes;
  int64_t s2;
  int64_t s1;
  int64_t c;
  int64_t y;
  int threads;
  uint64_t in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  int iVar8;
  Vector<int,_std::allocator<int>_> *in_stack_fffffffffffffee8;
  long lVar9;
  Vector<int,_std::allocator<int>_> *a;
  long x_00;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 uVar10;
  undefined4 in_stack_ffffffffffffff2c;
  int64_t in_stack_ffffffffffffff30;
  int64_t in_stack_ffffffffffffff38;
  int64_t in_stack_ffffffffffffff40;
  size_t local_b8;
  size_t local_b0;
  Vector<int,_std::allocator<int>_> local_90;
  Vector<int,_std::allocator<int>_> local_68;
  Vector<int,_std::allocator<int>_> local_50;
  long local_38;
  long local_30;
  uint64_t local_28;
  Vector<int,_std::allocator<int>_> *local_20;
  undefined4 local_14;
  long local_10;
  long local_8;
  
  if (in_RDI < 2) {
    local_8 = 0;
  }
  else {
    local_14 = 1;
    local_10 = in_RDI;
    local_20 = (Vector<int,_std::allocator<int>_> *)
               (anonymous_namespace)::iroot<3,long>
                         (CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    local_28 = PhiTiny::get_c(in_stack_fffffffffffffec8);
    local_30 = 0;
    local_38 = 0;
    generate_primes<int>(in_stack_fffffffffffffec8);
    generate_lpf(CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    generate_moebius(CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    sVar2 = Vector<int,_std::allocator<int>_>::size(&local_50);
    lVar3 = sVar2 - 1;
    a = local_20;
    x_00 = lVar3;
    uVar10 = local_14;
    bVar1 = primecount::is_print();
    iVar4 = P2(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               CONCAT13(bVar1,(int3)in_stack_ffffffffffffff2c),SUB41((uint)uVar10 >> 0x18,0));
    lVar9 = local_10;
    for (local_b0 = 1; local_b8 = local_28, (long)local_b0 <= (long)local_20;
        local_b0 = local_b0 + 1) {
      piVar5 = Vector<int,_std::allocator<int>_>::operator[](&local_68,local_b0);
      iVar8 = *piVar5;
      piVar5 = Vector<int,_std::allocator<int>_>::operator[](&local_50,local_28);
      if (*piVar5 < iVar8) {
        piVar5 = Vector<int,_std::allocator<int>_>::operator[](&local_90,local_b0);
        iVar8 = *piVar5;
        iVar6 = primecount::phi(x_00,(int64_t)a,(int)((ulong)lVar9 >> 0x20),
                                SUB81((ulong)lVar9 >> 0x18,0));
        local_30 = iVar8 * iVar6 + local_30;
      }
    }
    while (local_b8 = local_b8 + 1, (long)local_b8 < lVar3) {
      in_stack_fffffffffffffee8 = local_20;
      piVar5 = Vector<int,_std::allocator<int>_>::operator[](&local_50,local_b8);
      sVar2 = (long)in_stack_fffffffffffffee8 / (long)*piVar5;
      while (sVar2 = sVar2 + 1, (long)sVar2 <= (long)local_20) {
        piVar5 = Vector<int,_std::allocator<int>_>::operator[](&local_68,sVar2);
        iVar8 = *piVar5;
        piVar5 = Vector<int,_std::allocator<int>_>::operator[](&local_50,local_b8);
        if (*piVar5 < iVar8) {
          piVar5 = Vector<int,_std::allocator<int>_>::operator[](&local_90,sVar2);
          lVar7 = (long)*piVar5;
          Vector<int,_std::allocator<int>_>::operator[](&local_50,local_b8);
          iVar6 = primecount::phi(x_00,(int64_t)a,(int)((ulong)lVar9 >> 0x20),
                                  SUB81((ulong)lVar9 >> 0x18,0));
          local_38 = local_38 - lVar7 * iVar6;
        }
      }
    }
    local_8 = (local_30 + local_38 + lVar3 + -1) - iVar4;
    Vector<int,_std::allocator<int>_>::~Vector(in_stack_fffffffffffffee8);
    Vector<int,_std::allocator<int>_>::~Vector(in_stack_fffffffffffffee8);
    Vector<int,_std::allocator<int>_>::~Vector(in_stack_fffffffffffffee8);
  }
  return local_8;
}

Assistant:

int64_t pi_lmo1(int64_t x)
{
  if (x < 2)
    return 0;

  int threads = 1;
  int64_t y = iroot<3>(x);
  int64_t c = PhiTiny::get_c(y);
  int64_t s1 = 0;
  int64_t s2 = 0;

  auto primes = generate_primes<int32_t>(y);
  auto lpf = generate_lpf(y);
  auto mu = generate_moebius(y);
  bool is_print = false;

  int64_t pi_y = primes.size() - 1;
  int64_t p2 = P2(x, y, pi_y, threads);

  // ordinary leaves
  for (int64_t n = 1; n <= y; n++)
    if (lpf[n] > primes[c])
      s1 += mu[n] * phi(x / n, c, threads, is_print);

  // special leaves
  for (int64_t b = c + 1; b < pi_y; b++)
    for (int64_t m = (y / primes[b]) + 1; m <= y; m++)
      if (lpf[m] > primes[b])
        s2 -= mu[m] * phi(x / (primes[b] * m), b - 1, threads, is_print);

  int64_t phi = s1 + s2;
  int64_t sum = phi + pi_y - 1 - p2;

  return sum;
}